

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::reactive_socket_recv_op_base
          (reactive_socket_recv_op_base<asio::mutable_buffers_1> *this,socket_type socket,
          state_type state,mutable_buffers_1 *buffers,message_flags flags,func_type complete_func)

{
  undefined8 *in_RCX;
  code in_DL;
  undefined4 in_ESI;
  func_type in_RDI;
  undefined4 in_R8D;
  perform_func_type in_R9;
  undefined4 in_stack_ffffffffffffffe0;
  
  reactor_op::reactor_op((reactor_op *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,in_RDI);
  *(undefined4 *)(in_RDI + 0x38) = in_ESI;
  in_RDI[0x3c] = in_DL;
  *(undefined8 *)(in_RDI + 0x40) = *in_RCX;
  *(undefined8 *)(in_RDI + 0x48) = in_RCX[1];
  *(undefined4 *)(in_RDI + 0x50) = in_R8D;
  return;
}

Assistant:

reactive_socket_recv_op_base(socket_type socket,
      socket_ops::state_type state, const MutableBufferSequence& buffers,
      socket_base::message_flags flags, func_type complete_func)
    : reactor_op(&reactive_socket_recv_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      buffers_(buffers),
      flags_(flags)
  {
  }